

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d80c83::TargetIncludeDirectoriesImpl::HandleInterfaceContent
          (TargetIncludeDirectoriesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  undefined1 local_a8 [63];
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string joined;
  bool system_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  TargetIncludeDirectoriesImpl *this_local;
  
  joined.field_2._M_local_buf[0xe] = system;
  joined.field_2._M_local_buf[0xf] = prepend;
  ::cmTargetPropCommandBase::HandleInterfaceContent
            (&this->super_cmTargetPropCommandBase,tgt,content,prepend,system);
  if ((joined.field_2._M_local_buf[0xe] & 1U) != 0) {
    (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])(local_48,this,content)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_69);
    cmMakefile::GetBacktrace((cmMakefile *)local_a8);
    std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
              ((optional<cmListFileBacktrace> *)(local_a8 + 0x10),(cmListFileBacktrace *)local_a8);
    cmTarget::AppendProperty
              (tgt,&local_68,(string *)local_48,(optional<cmListFileBacktrace> *)(local_a8 + 0x10),
               false);
    std::optional<cmListFileBacktrace>::~optional
              ((optional<cmListFileBacktrace> *)(local_a8 + 0x10));
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_a8);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void TargetIncludeDirectoriesImpl::HandleInterfaceContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend,
  bool system)
{
  this->cmTargetPropCommandBase::HandleInterfaceContent(tgt, content, prepend,
                                                        system);
  if (system) {
    std::string joined = this->Join(content);
    tgt->AppendProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", joined,
                        this->Makefile->GetBacktrace());
  }
}